

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_primitives.h
# Opt level: O2

void tokenize<std::vector<substring,std::allocator<substring>>>
               (char delim,substring s,vector<substring,_std::allocator<substring>_> *ret,
               bool allow_empty)

{
  pointer psVar1;
  char *pcVar2;
  substring temp;
  value_type local_40;
  
  local_40.begin = s.begin;
  psVar1 = (ret->super__Vector_base<substring,_std::allocator<substring>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((ret->super__Vector_base<substring,_std::allocator<substring>_>)._M_impl.
      super__Vector_impl_data._M_finish != psVar1) {
    (ret->super__Vector_base<substring,_std::allocator<substring>_>)._M_impl.super__Vector_impl_data
    ._M_finish = psVar1;
  }
  for (pcVar2 = local_40.begin; local_40.end = pcVar2, pcVar2 != s.end; pcVar2 = pcVar2 + 1) {
    if (*pcVar2 == delim) {
      if (pcVar2 != local_40.begin || allow_empty) {
        std::vector<substring,_std::allocator<substring>_>::push_back(ret,&local_40);
      }
      local_40.begin = pcVar2 + 1;
    }
  }
  if ((allow_empty) || (local_40.begin != s.end)) {
    std::vector<substring,_std::allocator<substring>_>::push_back(ret,&local_40);
  }
  return;
}

Assistant:

void tokenize(char delim, substring s, ContainerT& ret, bool allow_empty = false)
{
  ret.clear();
  char* last = s.begin;
  for (; s.begin != s.end; s.begin++)
  {
    if (*s.begin == delim)
    {
      if (allow_empty || (s.begin != last))
      {
        substring temp = {last, s.begin};
        ret.push_back(temp);
      }
      last = s.begin + 1;
    }
  }
  if (allow_empty || (s.begin != last))
  {
    substring final_substring = {last, s.begin};
    ret.push_back(final_substring);
  }
}